

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSignal_POSIX.c
# Opt level: O2

UINT8 OSSignal_Wait(OS_SIGNAL *sig)

{
  UINT8 UVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)sig);
  UVar1 = 0xff;
  if (iVar2 == 0) {
    iVar2 = 0;
    while ((sig->state == '\0' && (iVar2 == 0))) {
      iVar2 = pthread_cond_wait((pthread_cond_t *)&sig->hCond,(pthread_mutex_t *)sig);
    }
    sig->state = '\0';
    pthread_mutex_unlock((pthread_mutex_t *)sig);
    UVar1 = -(iVar2 != 0);
  }
  return UVar1;
}

Assistant:

UINT8 OSSignal_Wait(OS_SIGNAL* sig)
{
	int retVal;
	
	retVal = pthread_mutex_lock(&sig->hMutex);
	if (retVal)
		return 0xFF;
	
	while(! sig->state && ! retVal)
		retVal = pthread_cond_wait(&sig->hCond, &sig->hMutex);
	sig->state = 0;	// reset signal after catching it successfully
	
	pthread_mutex_unlock(&sig->hMutex);
	return retVal ? 0xFF : 0x00;
}